

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::LightningGroup> * metaf::LightningGroup::fromLtgGroup(string *group)

{
  bool bVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ulong in_RSI;
  optional<metaf::LightningGroup> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> currType;
  int lightningTypeCount;
  uint currPos;
  LightningGroup result;
  optional<metaf::LightningGroup> notRecognised;
  LightningGroup *in_stack_fffffffffffffed8;
  LightningGroup *in_stack_fffffffffffffee0;
  string local_f8 [32];
  int local_d8;
  uint local_d4;
  string local_d0 [56];
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_5c [84];
  ulong local_8;
  
  local_8 = in_RSI;
  std::optional<metaf::LightningGroup>::optional((optional<metaf::LightningGroup> *)0x250086);
  LightningGroup(in_stack_fffffffffffffee0);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
  if (bVar1) {
    std::optional<metaf::LightningGroup>::optional<metaf::LightningGroup,_true>
              ((optional<metaf::LightningGroup> *)in_stack_fffffffffffffee0,
               in_stack_fffffffffffffed8);
  }
  else {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 < 3) {
      memcpy(in_RDI,local_5c,0x54);
    }
    else {
      std::__cxx11::string::substr((ulong)local_d0,local_8);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
      std::__cxx11::string::~string(local_d0);
      if (bVar1) {
        memcpy(in_RDI,local_5c,0x54);
      }
      else {
        local_d4 = 3;
        local_d8 = 0;
        while( true ) {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (ulong)local_d4;
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::__cxx11::string::length();
          if (pbVar3 <= __lhs || 5 < local_d8) break;
          std::__cxx11::string::substr((ulong)local_f8,local_8);
          local_d4 = local_d4 + 2;
          local_d8 = local_d8 + 1;
          bVar1 = std::operator==(__lhs,(char *)in_stack_fffffffffffffed8);
          if (bVar1) {
            local_97 = 1;
          }
          else {
            bVar1 = std::operator==(__lhs,(char *)in_stack_fffffffffffffed8);
            if (bVar1) {
              local_96 = 1;
            }
            else {
              bVar1 = std::operator==(__lhs,(char *)in_stack_fffffffffffffed8);
              if (bVar1) {
                local_98 = 1;
              }
              else {
                bVar1 = std::operator==(__lhs,(char *)in_stack_fffffffffffffed8);
                if (bVar1) {
                  local_95 = 1;
                }
                else {
                  local_94 = 1;
                }
              }
            }
          }
          std::__cxx11::string::~string(local_f8);
        }
        std::optional<metaf::LightningGroup>::optional<metaf::LightningGroup,_true>
                  ((optional<metaf::LightningGroup> *)__lhs,in_stack_fffffffffffffed8);
      }
    }
  }
  return in_RDI;
}

Assistant:

std::optional<LightningGroup> LightningGroup::fromLtgGroup(const std::string & group) {
	std::optional<LightningGroup> notRecognised;
	static const auto ltgLen = 3u; // length of string LTG
	static const char ltg[ltgLen + 1] = "LTG";

	LightningGroup result;
	if (group == ltg) return (result);

	if (group.length() < ltgLen) return notRecognised;
	if (group.substr(0, ltgLen) != ltg) return notRecognised;

	auto currPos = ltgLen;
	static const auto typeLen = 2;
	static const auto maxLightningTypeCount = 
		6; // arbitrary number greater than 4; well formed group can have max 4 types
	auto lightningTypeCount = 0;
	while(currPos < group.length() && lightningTypeCount < maxLightningTypeCount) {
		const auto currType = group.substr(currPos, typeLen);
		currPos += typeLen;
		lightningTypeCount++;
		if (currType == "IC") { result.typeInCloud = true; continue; }
		if (currType == "CC") { result.typeCloudCloud = true; continue; }
		if (currType == "CG") { result.typeCloudGround = true; continue; }
		if (currType == "CA") { result.typeCloudAir = true; continue; }
		result.typeUnknown = true;
	}
	return result;
}